

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleditemdelegate.cpp
# Opt level: O1

QWidget * __thiscall
QStyledItemDelegate::createEditor
          (QStyledItemDelegate *this,QWidget *parent,QStyleOptionViewItem *option,QModelIndex *index
          )

{
  QAbstractItemModel *pQVar1;
  uint uVar2;
  int iVar3;
  QItemEditorFactory *pQVar4;
  undefined4 extraout_var;
  long in_FS_OFFSET;
  anon_union_24_3_e3d07ef4_for_data local_48;
  undefined8 local_30;
  long local_20;
  QWidget *pQVar5;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = (QWidget *)0x0;
  if (((-1 < index->r) && (-1 < index->c)) && ((index->m).ptr != (QAbstractItemModel *)0x0)) {
    pQVar4 = *(QItemEditorFactory **)(*(long *)(this + 8) + 0x78);
    if (pQVar4 == (QItemEditorFactory *)0x0) {
      pQVar4 = QItemEditorFactory::defaultFactory();
    }
    pQVar1 = (index->m).ptr;
    if (pQVar1 == (QAbstractItemModel *)0x0) {
      local_48.shared = (PrivateShared *)0x0;
      local_48._8_8_ = 0;
      local_48._16_8_ = 0;
      local_30 = 2;
    }
    else {
      (**(code **)(*(long *)pQVar1 + 0x90))(&local_48,pQVar1,index,2);
    }
    uVar2 = ::QVariant::typeId((QVariant *)&local_48);
    iVar3 = (*pQVar4->_vptr_QItemEditorFactory[2])(pQVar4,(ulong)uVar2,parent);
    pQVar5 = (QWidget *)CONCAT44(extraout_var,iVar3);
    ::QVariant::~QVariant((QVariant *)&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return pQVar5;
  }
  __stack_chk_fail();
}

Assistant:

QWidget *QStyledItemDelegate::createEditor(QWidget *parent,
                                     const QStyleOptionViewItem &option,
                                     const QModelIndex &index) const
{
    Q_UNUSED(option);
    Q_D(const QStyledItemDelegate);
    if (!index.isValid())
        return nullptr;
    return d->editorFactory()->createEditor(index.data(Qt::EditRole).userType(), parent);
}